

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
ArrayState<false>::StartArray(ArrayState<false> *this,Context<false> *ctx)

{
  stringstream *psVar1;
  
  if ((ArrayState<false> *)ctx->previous_state == this) {
    psVar1 = Context<false>::error_abi_cxx11_(ctx);
    std::operator<<((ostream *)(psVar1 + 0x10),"Nested arrays are not supported");
    this = (ArrayState<false> *)0x0;
  }
  else {
    Context<false>::PushNamespace(ctx,ctx->key,ctx->previous_state);
    this->array_hash =
         (ctx->namespace_path).
         super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].namespace_hash;
  }
  return &this->super_BaseState<false>;
}

Assistant:

BaseState<audit>* StartArray(Context<audit>& ctx)
  {
    if (ctx.previous_state == this)
    {
      ctx.error() << "Nested arrays are not supported";
      return nullptr;
    }

    ctx.PushNamespace(ctx.key, ctx.previous_state);

    array_hash = ctx.CurrentNamespace().namespace_hash;

    return this;
  }